

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamWriter_p.cpp
# Opt level: O2

void __thiscall
BamTools::Internal::BamWriterPrivate::CreatePackedCigar
          (BamWriterPrivate *this,
          vector<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_> *cigarOperations,
          string *packedCigar)

{
  char cVar1;
  pointer pCVar2;
  uint *puVar3;
  BamException *this_00;
  pointer pCVar4;
  uint uVar5;
  allocator local_69;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  string message;
  
  std::__cxx11::string::resize((ulong)packedCigar);
  puVar3 = (uint *)(packedCigar->_M_dataplus)._M_p;
  pCVar4 = (cigarOperations->
           super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>)._M_impl.
           super__Vector_impl_data._M_start;
  pCVar2 = (cigarOperations->
           super__Vector_base<BamTools::CigarOp,_std::allocator<BamTools::CigarOp>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  do {
    if (pCVar4 == pCVar2) {
      return;
    }
    cVar1 = pCVar4->Type;
    switch(cVar1) {
    case 'H':
      uVar5 = 5;
      break;
    case 'I':
      uVar5 = 1;
      break;
    case 'J':
    case 'K':
    case 'L':
    case 'O':
    case 'Q':
    case 'R':
    case 'T':
    case 'U':
    case 'V':
    case 'W':
switchD_0013da3e_caseD_4a:
      std::__cxx11::string::string((string *)&local_68,"invalid CIGAR operation type",&local_69);
      std::operator+(&message,&local_68,pCVar4->Type);
      std::__cxx11::string::~string((string *)&local_68);
      this_00 = (BamException *)__cxa_allocate_exception(0x28);
      std::__cxx11::string::string((string *)&local_68,"BamWriter::CreatePackedCigar",&local_69);
      BamException::BamException(this_00,&local_68,&message);
      __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
    case 'M':
      uVar5 = 0;
      break;
    case 'N':
      uVar5 = 3;
      break;
    case 'P':
      uVar5 = 6;
      break;
    case 'S':
      uVar5 = 4;
      break;
    case 'X':
      uVar5 = 8;
      break;
    default:
      if (cVar1 == '=') {
        uVar5 = 7;
      }
      else {
        if (cVar1 != 'D') goto switchD_0013da3e_caseD_4a;
        uVar5 = 2;
      }
    }
    *puVar3 = pCVar4->Length << 4 | uVar5;
    puVar3 = puVar3 + 1;
    pCVar4 = pCVar4 + 1;
  } while( true );
}

Assistant:

void BamWriterPrivate::CreatePackedCigar(const std::vector<CigarOp>& cigarOperations,
                                         std::string& packedCigar)
{

    // initialize
    const std::size_t numCigarOperations = cigarOperations.size();
    packedCigar.resize(numCigarOperations * Constants::BAM_SIZEOF_INT);

    // pack the cigar data into the string
    unsigned int* pPackedCigar = (unsigned int*)packedCigar.data();

    // iterate over cigar operations
    std::vector<CigarOp>::const_iterator coIter = cigarOperations.begin();
    std::vector<CigarOp>::const_iterator coEnd = cigarOperations.end();
    for (; coIter != coEnd; ++coIter) {

        // store op in packedCigar
        uint8_t cigarOp;
        switch (coIter->Type) {
            case (Constants::BAM_CIGAR_MATCH_CHAR):
                cigarOp = Constants::BAM_CIGAR_MATCH;
                break;
            case (Constants::BAM_CIGAR_INS_CHAR):
                cigarOp = Constants::BAM_CIGAR_INS;
                break;
            case (Constants::BAM_CIGAR_DEL_CHAR):
                cigarOp = Constants::BAM_CIGAR_DEL;
                break;
            case (Constants::BAM_CIGAR_REFSKIP_CHAR):
                cigarOp = Constants::BAM_CIGAR_REFSKIP;
                break;
            case (Constants::BAM_CIGAR_SOFTCLIP_CHAR):
                cigarOp = Constants::BAM_CIGAR_SOFTCLIP;
                break;
            case (Constants::BAM_CIGAR_HARDCLIP_CHAR):
                cigarOp = Constants::BAM_CIGAR_HARDCLIP;
                break;
            case (Constants::BAM_CIGAR_PAD_CHAR):
                cigarOp = Constants::BAM_CIGAR_PAD;
                break;
            case (Constants::BAM_CIGAR_SEQMATCH_CHAR):
                cigarOp = Constants::BAM_CIGAR_SEQMATCH;
                break;
            case (Constants::BAM_CIGAR_MISMATCH_CHAR):
                cigarOp = Constants::BAM_CIGAR_MISMATCH;
                break;
            default:
                const std::string message =
                    std::string("invalid CIGAR operation type") + coIter->Type;
                throw BamException("BamWriter::CreatePackedCigar", message);
        }

        *pPackedCigar = coIter->Length << Constants::BAM_CIGAR_SHIFT | cigarOp;
        pPackedCigar++;
    }
}